

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.cpp
# Opt level: O0

string * __thiscall OpenMD::Stats::getStatsReport_abi_cxx11_(Stats *this)

{
  bool bVar1;
  _Setw _Var2;
  reference pvVar3;
  ostream *poVar4;
  ulong uVar5;
  size_t sVar6;
  double *pdVar7;
  long in_RSI;
  string *in_RDI;
  RealType RVar8;
  Mat3x3d e_2;
  Mat3x3d s_2;
  uint j;
  potVec e_1;
  potVec s_1;
  Vector3d e;
  Vector3d s;
  uint i;
  string head;
  int nSamp;
  string rlc;
  string rex;
  string ruc;
  string llc;
  string lex;
  string luc;
  string pm;
  stringstream report;
  char *in_stack_fffffffffffff088;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff090;
  int index;
  Stats *in_stack_fffffffffffff098;
  Stats *in_stack_fffffffffffff0a0;
  size_type in_stack_fffffffffffff0a8;
  undefined4 in_stack_fffffffffffff0b0;
  _Setw in_stack_fffffffffffff0b4;
  Stats *in_stack_fffffffffffff0b8;
  ostream *in_stack_fffffffffffff0c0;
  int index_00;
  Stats *in_stack_fffffffffffff0c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff0d0;
  bool local_821;
  long *local_730;
  string local_6a0 [32];
  int local_680;
  int local_67c;
  int local_678;
  int local_674;
  string local_670 [32];
  int local_650;
  int local_64c;
  int local_648;
  int local_644;
  RectMatrix<double,_3U,_3U> local_640;
  RectMatrix<double,_3U,_3U> local_5f8;
  string local_5b0 [32];
  string local_590 [36];
  int local_56c;
  int local_568;
  int local_564;
  int local_560;
  int local_55c;
  int local_558;
  int local_54c;
  int local_548;
  uint local_544;
  string local_540 [36];
  int local_51c;
  Vector<double,_7U> local_518;
  Vector<double,_7U> local_4e0;
  string local_4a8 [32];
  int local_488;
  int local_484;
  string local_480 [36];
  int local_45c;
  int local_458;
  int local_454;
  string local_450 [36];
  int local_42c;
  int local_428;
  int local_424;
  Vector<double,_3U> local_420;
  Vector<double,_3U> local_408;
  string local_3f0 [32];
  string local_3d0 [36];
  int local_3ac;
  int local_3a8;
  int local_3a4;
  string local_3a0 [36];
  int local_37c;
  string local_378 [32];
  reference local_358;
  uint local_344;
  int local_340;
  int local_33c;
  string local_338 [32];
  int local_318;
  int local_314;
  int local_310;
  allocator<char> local_309;
  string local_308 [39];
  allocator<char> local_2e1;
  string local_2e0 [32];
  int local_2c0;
  allocator<char> local_2b9;
  string local_2b8 [39];
  allocator<char> local_291;
  string local_290 [39];
  allocator<char> local_269;
  string local_268 [39];
  allocator<char> local_241;
  string local_240 [39];
  allocator<char> local_219;
  string local_218 [39];
  allocator<char> local_1f1;
  string local_1f0 [55];
  allocator<char> local_1b9;
  string local_1b8 [32];
  stringstream local_198 [16];
  ostream local_188 [392];
  
  std::__cxx11::stringstream::stringstream(local_198);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff0d0,(char *)in_stack_fffffffffffff0c8,
             (allocator<char> *)in_stack_fffffffffffff0c0);
  std::allocator<char>::~allocator(&local_1b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff0d0,(char *)in_stack_fffffffffffff0c8,
             (allocator<char> *)in_stack_fffffffffffff0c0);
  std::allocator<char>::~allocator(&local_1f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff0d0,(char *)in_stack_fffffffffffff0c8,
             (allocator<char> *)in_stack_fffffffffffff0c0);
  std::allocator<char>::~allocator(&local_219);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff0d0,(char *)in_stack_fffffffffffff0c8,
             (allocator<char> *)in_stack_fffffffffffff0c0);
  std::allocator<char>::~allocator(&local_241);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff0d0,(char *)in_stack_fffffffffffff0c8,
             (allocator<char> *)in_stack_fffffffffffff0c0);
  std::allocator<char>::~allocator(&local_269);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff0d0,(char *)in_stack_fffffffffffff0c8,
             (allocator<char> *)in_stack_fffffffffffff0c0);
  std::allocator<char>::~allocator(&local_291);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff0d0,(char *)in_stack_fffffffffffff0c8,
             (allocator<char> *)in_stack_fffffffffffff0c0);
  std::allocator<char>::~allocator(&local_2b9);
  pvVar3 = std::vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>::
           operator[]((vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_> *
                      )(in_RSI + 0x18),0);
  if (pvVar3->accumulator == (BaseAccumulator *)0x0) {
    local_730 = (long *)0x0;
  }
  else {
    local_730 = (long *)__dynamic_cast(pvVar3->accumulator,&BaseAccumulator::typeinfo,
                                       &Accumulator::typeinfo,0);
  }
  local_2c0 = (**(code **)(*local_730 + 8))();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff0b4._M_n,in_stack_fffffffffffff0b0),
             in_stack_fffffffffffff0a8,(char)((ulong)in_stack_fffffffffffff0a0 >> 0x38),
             (allocator<char> *)in_stack_fffffffffffff098);
  std::allocator<char>::~allocator(&local_2e1);
  poVar4 = std::operator<<(local_188,local_2e0);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<(local_188,"# Status Report:");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff0b4._M_n,in_stack_fffffffffffff0b0),
             in_stack_fffffffffffff0a8,(char)((ulong)in_stack_fffffffffffff0a0 >> 0x38),
             (allocator<char> *)in_stack_fffffffffffff098);
  poVar4 = std::operator<<(poVar4,local_308);
  poVar4 = std::operator<<(poVar4,"#");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_308);
  std::allocator<char>::~allocator(&local_309);
  poVar4 = std::operator<<(local_188,"# ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::right);
  local_310 = (int)std::setw(0x18);
  poVar4 = std::operator<<(poVar4,(_Setw)local_310);
  std::operator<<(poVar4,"Total Time:");
  local_314 = (int)std::setw(0xc);
  poVar4 = std::operator<<(local_188,(_Setw)local_314);
  RVar8 = getRealData(in_stack_fffffffffffff0a0,(int)((ulong)in_stack_fffffffffffff098 >> 0x20));
  std::ostream::operator<<(poVar4,RVar8);
  poVar4 = std::operator<<(local_188," ");
  local_318 = (int)std::setw(0x11);
  poVar4 = std::operator<<(poVar4,(_Setw)local_318);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::left);
  getUnits_abi_cxx11_(in_stack_fffffffffffff098,(int)((ulong)in_stack_fffffffffffff090 >> 0x20));
  poVar4 = std::operator<<(poVar4,local_338);
  poVar4 = std::operator<<(poVar4,"                      #");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_338);
  poVar4 = std::operator<<(local_188,"# ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::right);
  local_33c = (int)std::setw(0x18);
  poVar4 = std::operator<<(poVar4,(_Setw)local_33c);
  std::operator<<(poVar4,"Number of Samples:");
  local_340 = (int)std::setw(0xc);
  poVar4 = std::operator<<(local_188,(_Setw)local_340);
  std::ostream::operator<<(poVar4,local_2c0);
  poVar4 = std::operator<<(local_188,"                                        #");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  for (local_344 = 0; uVar5 = (ulong)local_344,
      sVar6 = std::bitset<46UL>::size((bitset<46UL> *)(in_RSI + 0x30)), uVar5 < sVar6;
      local_344 = local_344 + 1) {
    std::bitset<46UL>::operator[]
              ((bitset<46UL> *)in_stack_fffffffffffff098,(size_t)in_stack_fffffffffffff090);
    local_821 = std::bitset::reference::operator_cast_to_bool
                          ((reference *)in_stack_fffffffffffff090);
    local_821 = local_821 && local_344 != 0;
    std::bitset<46UL>::reference::~reference(&local_358);
    if (local_821) {
      getDataType_abi_cxx11_
                (in_stack_fffffffffffff098,(int)((ulong)in_stack_fffffffffffff090 >> 0x20));
      bVar1 = std::operator==(in_stack_fffffffffffff090,in_stack_fffffffffffff088);
      std::__cxx11::string::~string(local_378);
      if (bVar1) {
        poVar4 = std::operator<<(local_188,"# ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::right);
        local_37c = (int)std::setw(0x17);
        poVar4 = std::operator<<(poVar4,(_Setw)local_37c);
        getTitle_abi_cxx11_(in_stack_fffffffffffff098,
                            (int)((ulong)in_stack_fffffffffffff090 >> 0x20));
        poVar4 = std::operator<<(poVar4,local_3a0);
        std::operator<<(poVar4,":");
        std::__cxx11::string::~string(local_3a0);
        poVar4 = (ostream *)std::ostream::operator<<(local_188,std::right);
        local_3a4 = (int)std::setw(0xc);
        poVar4 = std::operator<<(poVar4,(_Setw)local_3a4);
        RVar8 = getRealAverage(in_stack_fffffffffffff0a0,
                               (int)((ulong)in_stack_fffffffffffff098 >> 0x20));
        std::ostream::operator<<(poVar4,RVar8);
        poVar4 = std::operator<<(local_188,local_1b8);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::left);
        local_3a8 = (int)std::setw(0xc);
        poVar4 = std::operator<<(poVar4,(_Setw)local_3a8);
        RVar8 = getRealError(in_stack_fffffffffffff0a0,
                             (int)((ulong)in_stack_fffffffffffff098 >> 0x20));
        std::ostream::operator<<(poVar4,RVar8);
        poVar4 = std::operator<<(local_188," ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::left);
        local_3ac = (int)std::setw(0x11);
        poVar4 = std::operator<<(poVar4,(_Setw)local_3ac);
        getUnits_abi_cxx11_(in_stack_fffffffffffff098,
                            (int)((ulong)in_stack_fffffffffffff090 >> 0x20));
        std::operator<<(poVar4,local_3d0);
        std::__cxx11::string::~string(local_3d0);
        poVar4 = std::operator<<(local_188,"     #");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      }
      else {
        getDataType_abi_cxx11_
                  (in_stack_fffffffffffff098,(int)((ulong)in_stack_fffffffffffff090 >> 0x20));
        bVar1 = std::operator==(in_stack_fffffffffffff090,in_stack_fffffffffffff088);
        std::__cxx11::string::~string(local_3f0);
        if (bVar1) {
          getVectorAverage(in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b4._M_n);
          getVectorError(in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b4._M_n);
          std::operator<<(local_188,"#                         ");
          poVar4 = std::operator<<(local_188,local_1f0);
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::right);
          local_424 = (int)std::setw(0xc);
          poVar4 = std::operator<<(poVar4,(_Setw)local_424);
          pdVar7 = Vector<double,_3U>::operator()(&local_408,0);
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pdVar7);
          poVar4 = std::operator<<(poVar4,local_268);
          std::operator<<(poVar4,"     ");
          poVar4 = std::operator<<(local_188,local_1f0);
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::right);
          local_428 = (int)std::setw(0xc);
          poVar4 = std::operator<<(poVar4,(_Setw)local_428);
          pdVar7 = Vector<double,_3U>::operator()(&local_420,0);
          std::ostream::operator<<(poVar4,*pdVar7);
          poVar4 = std::operator<<(local_188,local_268);
          poVar4 = std::operator<<(poVar4,"                   #");
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          poVar4 = std::operator<<(local_188,"# ");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::right);
          local_42c = (int)std::setw(0x17);
          poVar4 = std::operator<<(poVar4,(_Setw)local_42c);
          getTitle_abi_cxx11_(in_stack_fffffffffffff098,
                              (int)((ulong)in_stack_fffffffffffff090 >> 0x20));
          poVar4 = std::operator<<(poVar4,local_450);
          std::operator<<(poVar4,":");
          std::__cxx11::string::~string(local_450);
          poVar4 = std::operator<<(local_188,local_218);
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::right);
          local_454 = (int)std::setw(0xc);
          poVar4 = std::operator<<(poVar4,(_Setw)local_454);
          pdVar7 = Vector<double,_3U>::operator()(&local_408,1);
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pdVar7);
          poVar4 = std::operator<<(poVar4,local_290);
          std::operator<<(poVar4,local_1b8);
          poVar4 = std::operator<<(local_188,local_218);
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::right);
          local_458 = (int)std::setw(0xc);
          poVar4 = std::operator<<(poVar4,(_Setw)local_458);
          pdVar7 = Vector<double,_3U>::operator()(&local_420,1);
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pdVar7);
          poVar4 = std::operator<<(poVar4,local_290);
          std::operator<<(poVar4," ");
          poVar4 = (ostream *)std::ostream::operator<<(local_188,std::left);
          local_45c = (int)std::setw(0x11);
          poVar4 = std::operator<<(poVar4,(_Setw)local_45c);
          getUnits_abi_cxx11_(in_stack_fffffffffffff098,
                              (int)((ulong)in_stack_fffffffffffff090 >> 0x20));
          poVar4 = std::operator<<(poVar4,local_480);
          std::operator<<(poVar4," #");
          std::__cxx11::string::~string(local_480);
          std::ostream::operator<<(local_188,std::endl<char,std::char_traits<char>>);
          std::operator<<(local_188,"#                         ");
          poVar4 = std::operator<<(local_188,local_240);
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::right);
          local_484 = (int)std::setw(0xc);
          poVar4 = std::operator<<(poVar4,(_Setw)local_484);
          pdVar7 = Vector<double,_3U>::operator()(&local_408,2);
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pdVar7);
          poVar4 = std::operator<<(poVar4,local_2b8);
          std::operator<<(poVar4,"     ");
          poVar4 = std::operator<<(local_188,local_240);
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::right);
          local_488 = (int)std::setw(0xc);
          poVar4 = std::operator<<(poVar4,(_Setw)local_488);
          pdVar7 = Vector<double,_3U>::operator()(&local_420,2);
          std::ostream::operator<<(poVar4,*pdVar7);
          poVar4 = std::operator<<(local_188,local_2b8);
          poVar4 = std::operator<<(poVar4,"                   #");
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        }
        else {
          getDataType_abi_cxx11_
                    (in_stack_fffffffffffff098,(int)((ulong)in_stack_fffffffffffff090 >> 0x20));
          bVar1 = std::operator==(in_stack_fffffffffffff090,in_stack_fffffffffffff088);
          std::__cxx11::string::~string(local_4a8);
          if (bVar1) {
            getPotVecAverage(in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b4._M_n);
            getPotVecError(in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b4._M_n);
            poVar4 = std::operator<<(local_188,"# ");
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::right);
            local_51c = (int)std::setw(0x17);
            poVar4 = std::operator<<(poVar4,(_Setw)local_51c);
            getTitle_abi_cxx11_(in_stack_fffffffffffff098,
                                (int)((ulong)in_stack_fffffffffffff090 >> 0x20));
            std::operator<<(poVar4,local_540);
            std::__cxx11::string::~string(local_540);
            std::operator<<(local_188,":                                                    #");
            std::ostream::operator<<(local_188,std::endl<char,std::char_traits<char>>);
            for (local_544 = 1; local_544 < 7; local_544 = local_544 + 1) {
              switch(local_544) {
              case 1:
                poVar4 = std::operator<<(local_188,"# ");
                poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::right);
                local_548 = (int)std::setw(0x18);
                poVar4 = std::operator<<(poVar4,(_Setw)local_548);
                std::operator<<(poVar4,"van der Waals:");
                break;
              case 2:
                poVar4 = std::operator<<(local_188,"# ");
                poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::right);
                local_54c = (int)std::setw(0x18);
                poVar4 = std::operator<<(poVar4,(_Setw)local_54c);
                std::operator<<(poVar4,"Electrostatic:");
                break;
              default:
                poVar4 = std::operator<<(local_188,"# ");
                poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::right);
                local_560 = (int)std::setw(0x18);
                poVar4 = std::operator<<(poVar4,(_Setw)local_560);
                std::operator<<(poVar4,"Unknown:");
                break;
              case 5:
                poVar4 = std::operator<<(local_188,"# ");
                poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::right);
                local_558 = (int)std::setw(0x18);
                poVar4 = std::operator<<(poVar4,(_Setw)local_558);
                std::operator<<(poVar4,"Hydrogen Bonding:");
                break;
              case 6:
                poVar4 = std::operator<<(local_188,"# ");
                poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::right);
                local_55c = (int)std::setw(0x18);
                poVar4 = std::operator<<(poVar4,(_Setw)local_55c);
                std::operator<<(poVar4,"Bonded (1-2,1-3,1-4):");
              }
              poVar4 = (ostream *)std::ostream::operator<<(local_188,std::right);
              local_564 = (int)std::setw(0xc);
              poVar4 = std::operator<<(poVar4,(_Setw)local_564);
              pdVar7 = Vector<double,_7U>::operator[](&local_4e0,local_544);
              std::ostream::operator<<(poVar4,*pdVar7);
              poVar4 = std::operator<<(local_188,local_1b8);
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::left);
              local_568 = (int)std::setw(0xc);
              poVar4 = std::operator<<(poVar4,(_Setw)local_568);
              pdVar7 = Vector<double,_7U>::operator[](&local_518,local_544);
              std::ostream::operator<<(poVar4,*pdVar7);
              poVar4 = std::operator<<(local_188," ");
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::left);
              local_56c = (int)std::setw(0x11);
              poVar4 = std::operator<<(poVar4,(_Setw)local_56c);
              getUnits_abi_cxx11_(in_stack_fffffffffffff098,
                                  (int)((ulong)in_stack_fffffffffffff090 >> 0x20));
              poVar4 = std::operator<<(poVar4,local_590);
              std::operator<<(poVar4,"     #");
              std::__cxx11::string::~string(local_590);
              std::ostream::operator<<(local_188,std::endl<char,std::char_traits<char>>);
            }
          }
          else {
            getDataType_abi_cxx11_
                      (in_stack_fffffffffffff098,(int)((ulong)in_stack_fffffffffffff090 >> 0x20));
            bVar1 = std::operator==(in_stack_fffffffffffff090,in_stack_fffffffffffff088);
            std::__cxx11::string::~string(local_5b0);
            index_00 = (int)((ulong)in_stack_fffffffffffff0c0 >> 0x20);
            if (bVar1) {
              getMatrixAverage(in_stack_fffffffffffff0c8,index_00);
              index = (int)((ulong)in_stack_fffffffffffff090 >> 0x20);
              getMatrixError(in_stack_fffffffffffff0c8,index_00);
              std::operator<<(local_188,"#                         ");
              poVar4 = std::operator<<(local_188,local_1f0);
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::right);
              local_644 = (int)std::setw(0xc);
              poVar4 = std::operator<<(poVar4,(_Setw)local_644);
              pdVar7 = RectMatrix<double,_3U,_3U>::operator()(&local_5f8,0,0);
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pdVar7);
              std::operator<<(poVar4," ");
              poVar4 = (ostream *)std::ostream::operator<<(local_188,std::right);
              local_648 = (int)std::setw(0xc);
              poVar4 = std::operator<<(poVar4,(_Setw)local_648);
              pdVar7 = RectMatrix<double,_3U,_3U>::operator()(&local_5f8,0,1);
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pdVar7);
              std::operator<<(poVar4," ");
              poVar4 = (ostream *)std::ostream::operator<<(local_188,std::right);
              local_64c = (int)std::setw(0xc);
              poVar4 = std::operator<<(poVar4,(_Setw)local_64c);
              pdVar7 = RectMatrix<double,_3U,_3U>::operator()(&local_5f8,0,2);
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pdVar7);
              poVar4 = std::operator<<(poVar4,local_268);
              std::operator<<(poVar4,"            #");
              std::ostream::operator<<(local_188,std::endl<char,std::char_traits<char>>);
              poVar4 = std::operator<<(local_188,"# ");
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::right);
              local_650 = (int)std::setw(0x17);
              poVar4 = std::operator<<(poVar4,(_Setw)local_650);
              getTitle_abi_cxx11_(in_stack_fffffffffffff098,index);
              poVar4 = std::operator<<(poVar4,local_670);
              std::operator<<(poVar4,":");
              std::__cxx11::string::~string(local_670);
              poVar4 = std::operator<<(local_188,local_218);
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::right);
              local_674 = (int)std::setw(0xc);
              poVar4 = std::operator<<(poVar4,(_Setw)local_674);
              pdVar7 = RectMatrix<double,_3U,_3U>::operator()(&local_5f8,1,0);
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pdVar7);
              std::operator<<(poVar4," ");
              poVar4 = (ostream *)std::ostream::operator<<(local_188,std::right);
              local_678 = (int)std::setw(0xc);
              poVar4 = std::operator<<(poVar4,(_Setw)local_678);
              pdVar7 = RectMatrix<double,_3U,_3U>::operator()(&local_5f8,1,1);
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pdVar7);
              std::operator<<(poVar4," ");
              poVar4 = (ostream *)std::ostream::operator<<(local_188,std::right);
              local_67c = (int)std::setw(0xc);
              poVar4 = std::operator<<(poVar4,(_Setw)local_67c);
              pdVar7 = RectMatrix<double,_3U,_3U>::operator()(&local_5f8,1,2);
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pdVar7);
              poVar4 = std::operator<<(poVar4,local_290);
              std::operator<<(poVar4," ");
              poVar4 = (ostream *)std::ostream::operator<<(local_188,std::left);
              local_680 = (int)std::setw(0xb);
              poVar4 = std::operator<<(poVar4,(_Setw)local_680);
              getUnits_abi_cxx11_(in_stack_fffffffffffff098,index);
              poVar4 = std::operator<<(poVar4,local_6a0);
              poVar4 = std::operator<<(poVar4,"#");
              std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
              std::__cxx11::string::~string(local_6a0);
              std::operator<<(local_188,"#                         ");
              poVar4 = std::operator<<(local_188,local_240);
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::right);
              _Var2 = std::setw(0xc);
              poVar4 = std::operator<<(poVar4,_Var2);
              pdVar7 = RectMatrix<double,_3U,_3U>::operator()(&local_5f8,2,0);
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pdVar7);
              std::operator<<(poVar4," ");
              poVar4 = (ostream *)std::ostream::operator<<(local_188,std::right);
              _Var2 = std::setw(0xc);
              poVar4 = std::operator<<(poVar4,_Var2);
              pdVar7 = RectMatrix<double,_3U,_3U>::operator()(&local_5f8,2,1);
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pdVar7);
              std::operator<<(poVar4," ");
              poVar4 = (ostream *)std::ostream::operator<<(local_188,std::right);
              _Var2 = std::setw(0xc);
              poVar4 = std::operator<<(poVar4,_Var2);
              pdVar7 = RectMatrix<double,_3U,_3U>::operator()(&local_5f8,2,2);
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pdVar7);
              poVar4 = std::operator<<(poVar4,local_2b8);
              std::operator<<(poVar4,"            #");
              std::ostream::operator<<(local_188,std::endl<char,std::char_traits<char>>);
              std::operator<<(local_188,"#                                 ");
              poVar4 = std::operator<<(local_188,local_1f0);
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::right);
              _Var2 = std::setw(0xc);
              poVar4 = std::operator<<(poVar4,_Var2);
              pdVar7 = RectMatrix<double,_3U,_3U>::operator()(&local_640,0,0);
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pdVar7);
              std::operator<<(poVar4," ");
              poVar4 = (ostream *)std::ostream::operator<<(local_188,std::right);
              _Var2 = std::setw(0xc);
              poVar4 = std::operator<<(poVar4,_Var2);
              pdVar7 = RectMatrix<double,_3U,_3U>::operator()(&local_640,0,1);
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pdVar7);
              std::operator<<(poVar4," ");
              poVar4 = (ostream *)std::ostream::operator<<(local_188,std::right);
              _Var2 = std::setw(0xc);
              poVar4 = std::operator<<(poVar4,_Var2);
              pdVar7 = RectMatrix<double,_3U,_3U>::operator()(&local_640,0,2);
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pdVar7);
              poVar4 = std::operator<<(poVar4,local_268);
              std::operator<<(poVar4,"    #");
              std::ostream::operator<<(local_188,std::endl<char,std::char_traits<char>>);
              poVar4 = std::operator<<(local_188,"#                            ");
              std::operator<<(poVar4,local_1b8);
              poVar4 = std::operator<<(local_188,local_218);
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::right);
              _Var2 = std::setw(0xc);
              poVar4 = std::operator<<(poVar4,_Var2);
              pdVar7 = RectMatrix<double,_3U,_3U>::operator()(&local_640,1,0);
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pdVar7);
              std::operator<<(poVar4," ");
              poVar4 = (ostream *)std::ostream::operator<<(local_188,std::right);
              _Var2 = std::setw(0xc);
              poVar4 = std::operator<<(poVar4,_Var2);
              pdVar7 = RectMatrix<double,_3U,_3U>::operator()(&local_640,1,1);
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pdVar7);
              std::operator<<(poVar4," ");
              poVar4 = (ostream *)std::ostream::operator<<(local_188,std::right);
              _Var2 = std::setw(0xc);
              poVar4 = std::operator<<(poVar4,_Var2);
              pdVar7 = RectMatrix<double,_3U,_3U>::operator()(&local_640,1,2);
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pdVar7);
              poVar4 = std::operator<<(poVar4,local_290);
              std::operator<<(poVar4,"    #");
              std::ostream::operator<<(local_188,std::endl<char,std::char_traits<char>>);
              std::operator<<(local_188,"#                                 ");
              poVar4 = std::operator<<(local_188,local_240);
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::right);
              _Var2 = std::setw(0xc);
              poVar4 = std::operator<<(poVar4,_Var2);
              pdVar7 = RectMatrix<double,_3U,_3U>::operator()(&local_640,2,0);
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pdVar7);
              std::operator<<(poVar4," ");
              poVar4 = (ostream *)std::ostream::operator<<(local_188,std::right);
              _Var2 = std::setw(0xc);
              poVar4 = std::operator<<(poVar4,_Var2);
              in_stack_fffffffffffff0c8 =
                   (Stats *)RectMatrix<double,_3U,_3U>::operator()(&local_640,2,1);
              in_stack_fffffffffffff0c0 =
                   (ostream *)
                   std::ostream::operator<<(poVar4,(double)in_stack_fffffffffffff0c8->_vptr_Stats);
              std::operator<<(in_stack_fffffffffffff0c0," ");
              in_stack_fffffffffffff0b8 = (Stats *)std::ostream::operator<<(local_188,std::right);
              in_stack_fffffffffffff0b4 = std::setw(0xc);
              poVar4 = std::operator<<((ostream *)in_stack_fffffffffffff0b8,
                                       in_stack_fffffffffffff0b4);
              in_stack_fffffffffffff0a0 =
                   (Stats *)RectMatrix<double,_3U,_3U>::operator()(&local_640,2,2);
              in_stack_fffffffffffff098 =
                   (Stats *)std::ostream::operator<<
                                      (poVar4,(double)in_stack_fffffffffffff0a0->_vptr_Stats);
              in_stack_fffffffffffff090 =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::operator<<((ostream *)in_stack_fffffffffffff098,local_2b8);
              std::operator<<((ostream *)in_stack_fffffffffffff090,"    #");
              std::ostream::operator<<(local_188,std::endl<char,std::char_traits<char>>);
              SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x2540a1);
              SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x2540ae);
            }
          }
        }
      }
    }
  }
  poVar4 = std::operator<<(local_188,local_2e0);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::__cxx11::stringstream::str();
  std::__cxx11::string::~string(local_2e0);
  std::__cxx11::string::~string(local_2b8);
  std::__cxx11::string::~string(local_290);
  std::__cxx11::string::~string(local_268);
  std::__cxx11::string::~string(local_240);
  std::__cxx11::string::~string(local_218);
  std::__cxx11::string::~string(local_1f0);
  std::__cxx11::string::~string(local_1b8);
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

std::string Stats::getStatsReport() {
    std::stringstream report;
#if defined(_MSC_VER)
    std::string pm  = " +/- ";
    std::string luc = "[";
    std::string lex = "|";
    std::string llc = "[";
    std::string ruc = "]";
    std::string rex = "|";
    std::string rlc = "]";
#else
    std::string pm  = "  \u00B1  ";
    std::string luc = "\u23A1";
    std::string lex = "\u23A2";
    std::string llc = "\u23A3";
    std::string ruc = "\u23A4";
    std::string rex = "\u23A5";
    std::string rlc = "\u23A6";
#endif

    int nSamp = dynamic_cast<Accumulator*>(data_[TIME].accumulator)->count();

    std::string head(79, '#');
    report << head << std::endl;
    report << "# Status Report:" << std::string(62, ' ') << "#" << std::endl;
    report << "# " << right << setw(24) << "Total Time:";
    report << setw(12) << getRealData(TIME);
    report << " " << setw(17) << left << getUnits(TIME)
           << "                      #" << std::endl;
    report << "# " << right << setw(24) << "Number of Samples:";
    report << setw(12) << nSamp;
    report << "                                        #" << std::endl;

    for (unsigned int i = 0; i < statsMask_.size(); ++i) {
      if (statsMask_[i] && i != TIME) {
        if (getDataType(i) == "RealType") {
          report << "# " << right << setw(23) << getTitle(i) << ":";
          report << right << setw(12) << getRealAverage(i);
          report << pm << left << setw(12) << getRealError(i);
          report << " " << left << setw(17) << getUnits(i);
          report << "     #" << std::endl;

        } else if (getDataType(i) == "Vector3d") {
          Vector3d s = getVectorAverage(i);
          Vector3d e = getVectorError(i);

          report << "#                         ";
          report << luc << right << setw(12) << s(0) << ruc << "     ";
          report << luc << right << setw(12) << e(0);
          report << ruc << "                   #" << std::endl;

          report << "# " << right << setw(23) << getTitle(i) << ":";

          report << lex << right << setw(12) << s(1) << rex << pm;
          report << lex << right << setw(12) << e(1) << rex << " ";
          report << left << setw(17) << getUnits(i) << " #";
          report << std::endl;

          report << "#                         ";
          report << llc << right << setw(12) << s(2) << rlc << "     ";
          report << llc << right << setw(12) << e(2);
          report << rlc << "                   #" << std::endl;

        } else if (getDataType(i) == "potVec") {
          potVec s = getPotVecAverage(i);
          potVec e = getPotVecError(i);

          report << "# " << right << setw(23) << getTitle(i);
          report << ":                                                    #";
          report << std::endl;

          for (unsigned int j = 1; j < N_INTERACTION_FAMILIES; j++) {
            switch (j) {
            case VANDERWAALS_FAMILY:
              report << "# " << right << setw(24) << "van der Waals:";
              break;
            case ELECTROSTATIC_FAMILY:
              report << "# " << right << setw(24) << "Electrostatic:";
              break;
            case METALLIC_EMBEDDING:
              report << "# " << right << setw(24) << "Metallic Embedding:";
              break;
            case METALLIC_PAIR:
              report << "# " << right << setw(24) << "Metallic Pair:";
              break;
            case HYDROGENBONDING_FAMILY:
              report << "# " << right << setw(24) << "Hydrogen Bonding:";
              break;
            case BONDED_FAMILY:
              report << "# " << right << setw(24) << "Bonded (1-2,1-3,1-4):";
              break;
            default:
              report << "# " << right << setw(24) << "Unknown:";
              break;
            }
            report << right << setw(12) << s[j];
            report << pm << left << setw(12) << e[j];
            report << " " << left << setw(17) << getUnits(i) << "     #";
            report << std::endl;
          }

        } else if (getDataType(i) == "Mat3x3d") {
          Mat3x3d s = getMatrixAverage(i);
          Mat3x3d e = getMatrixError(i);

          report << "#                         ";
          report << luc << right << setw(12) << s(0, 0) << " ";
          report << right << setw(12) << s(0, 1) << " ";
          report << right << setw(12) << s(0, 2) << ruc << "            #";
          report << std::endl;

          report << "# " << right << setw(23) << getTitle(i) << ":";

          report << lex << right << setw(12) << s(1, 0) << " ";
          report << right << setw(12) << s(1, 1) << " ";
          report << right << setw(12) << s(1, 2) << rex << " ";
          report << left << setw(11) << getUnits(i) << "#" << std::endl;

          report << "#                         ";
          report << llc << right << setw(12) << s(2, 0) << " ";
          report << right << setw(12) << s(2, 1) << " ";
          report << right << setw(12) << s(2, 2) << rlc << "            #";
          report << std::endl;

          report << "#                                 ";
          report << luc << right << setw(12) << e(0, 0) << " ";
          report << right << setw(12) << e(0, 1) << " ";
          report << right << setw(12) << e(0, 2) << ruc << "    #";
          report << std::endl;

          report << "#                            " << pm;

          report << lex << right << setw(12) << e(1, 0) << " ";
          report << right << setw(12) << e(1, 1) << " ";
          report << right << setw(12) << e(1, 2) << rex << "    #";
          report << std::endl;

          report << "#                                 ";
          report << llc << right << setw(12) << e(2, 0) << " ";
          report << right << setw(12) << e(2, 1) << " ";
          report << right << setw(12) << e(2, 2) << rlc << "    #";
          report << std::endl;
        }
      }
    }
    report << head << std::endl;

    return report.str();
  }